

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  undefined4 uVar1;
  long *plVar2;
  undefined4 *puVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  long lVar11;
  long in_RDI;
  bool bVar12;
  mz_uint32 t_2;
  mz_uint32 t_1;
  mz_uint64 root_1;
  mz_uint64 child_1;
  mz_uint32 t;
  mz_uint64 root;
  mz_uint64 child;
  mz_uint32 size;
  mz_uint32 end;
  mz_uint32 start;
  mz_uint32 *pIndices;
  mz_zip_array *pCentral_dir;
  mz_zip_array *pCentral_dir_offsets;
  mz_zip_internal_state *pState;
  mz_uint8 r_3;
  mz_uint8 l_3;
  mz_uint r_len_3;
  mz_uint l_len_3;
  mz_uint8 *pR_3;
  mz_uint8 *pE_3;
  mz_uint8 *pL_3;
  mz_uint8 r_2;
  mz_uint8 l_2;
  mz_uint r_len_2;
  mz_uint l_len_2;
  mz_uint8 *pR_2;
  mz_uint8 *pE_2;
  mz_uint8 *pL_2;
  mz_uint8 r_1;
  mz_uint8 l_1;
  mz_uint r_len_1;
  mz_uint l_len_1;
  mz_uint8 *pR_1;
  mz_uint8 *pE_1;
  mz_uint8 *pL_1;
  mz_uint8 r;
  mz_uint8 l;
  mz_uint r_len;
  mz_uint l_len;
  mz_uint8 *pR;
  mz_uint8 *pE;
  mz_uint8 *pL;
  uint local_1dc;
  uint local_1bc;
  bool local_1aa;
  uint local_19c;
  uint local_17c;
  bool local_169;
  long local_160;
  ulong local_148;
  uint local_130;
  uint local_12c;
  byte local_fa;
  byte local_f9;
  byte *local_f0;
  byte *local_e0;
  byte local_ba;
  byte local_b9;
  byte *local_b0;
  byte *local_a0;
  byte local_7a;
  byte local_79;
  byte *local_70;
  byte *local_60;
  byte local_3a;
  byte local_39;
  byte *local_30;
  byte *local_20;
  
  plVar2 = *(long **)(in_RDI + 0x68);
  plVar6 = plVar2 + 4;
  local_130 = *(uint *)(in_RDI + 0x10);
  if (local_130 < 2) {
    return;
  }
  puVar3 = (undefined4 *)plVar2[8];
  local_12c = local_130 - 2 >> 1;
  do {
    local_148 = (ulong)local_12c;
    while( true ) {
      lVar7 = local_148 * 2;
      uVar8 = lVar7 + 1;
      if (local_130 <= uVar8) break;
      local_169 = false;
      if (lVar7 + 2U < (ulong)local_130) {
        lVar9 = *plVar2 + (ulong)*(uint *)(*plVar6 + (ulong)(uint)puVar3[uVar8] * 4);
        lVar7 = *plVar2 + (ulong)*(uint *)(*plVar6 + (ulong)(uint)puVar3[lVar7 + 2] * 4);
        uVar4 = (uint)*(ushort *)(lVar9 + 0x1c);
        uVar5 = (uint)*(ushort *)(lVar7 + 0x1c);
        local_39 = 0;
        local_3a = 0;
        local_20 = (byte *)(lVar9 + 0x2e);
        local_30 = (byte *)(lVar7 + 0x2e);
        local_17c = uVar5;
        if (uVar4 < uVar5) {
          local_17c = uVar4;
        }
        pbVar10 = local_20 + local_17c;
        for (; local_20 < pbVar10; local_20 = local_20 + 1) {
          if ((*local_20 < 0x41) || (0x5a < *local_20)) {
            local_39 = *local_20;
          }
          else {
            local_39 = *local_20 + 0x20;
          }
          if ((*local_30 < 0x41) || (0x5a < *local_30)) {
            local_3a = *local_30;
          }
          else {
            local_3a = *local_30 + 0x20;
          }
          if (local_39 != local_3a) break;
          local_30 = local_30 + 1;
        }
        if (local_20 == pbVar10) {
          local_169 = uVar4 < uVar5;
        }
        else {
          local_169 = local_39 < local_3a;
        }
      }
      uVar8 = local_169 + uVar8;
      lVar7 = *plVar2 + (ulong)*(uint *)(*plVar6 + (ulong)(uint)puVar3[local_148] * 4);
      lVar9 = *plVar2 + (ulong)*(uint *)(*plVar6 + (ulong)(uint)puVar3[uVar8] * 4);
      uVar4 = (uint)*(ushort *)(lVar7 + 0x1c);
      uVar5 = (uint)*(ushort *)(lVar9 + 0x1c);
      local_79 = 0;
      local_7a = 0;
      local_60 = (byte *)(lVar7 + 0x2e);
      local_70 = (byte *)(lVar9 + 0x2e);
      local_19c = uVar5;
      if (uVar4 < uVar5) {
        local_19c = uVar4;
      }
      pbVar10 = local_60 + local_19c;
      for (; local_60 < pbVar10; local_60 = local_60 + 1) {
        if ((*local_60 < 0x41) || (0x5a < *local_60)) {
          local_79 = *local_60;
        }
        else {
          local_79 = *local_60 + 0x20;
        }
        if ((*local_70 < 0x41) || (0x5a < *local_70)) {
          local_7a = *local_70;
        }
        else {
          local_7a = *local_70 + 0x20;
        }
        if (local_79 != local_7a) break;
        local_70 = local_70 + 1;
      }
      if (local_60 == pbVar10) {
        bVar12 = uVar4 < uVar5;
      }
      else {
        bVar12 = local_79 < local_7a;
      }
      if (!bVar12) break;
      uVar1 = puVar3[local_148];
      puVar3[local_148] = puVar3[uVar8];
      puVar3[uVar8] = uVar1;
      local_148 = uVar8;
    }
    if (local_12c == 0) {
      do {
        local_130 = local_130 - 1;
        if (local_130 == 0) {
          return;
        }
        local_160 = 0;
        uVar1 = puVar3[local_130];
        puVar3[local_130] = *puVar3;
        *puVar3 = uVar1;
        while( true ) {
          lVar7 = local_160 * 2;
          uVar8 = lVar7 + 1;
          if (local_130 <= uVar8) break;
          local_1aa = false;
          if (lVar7 + 2U < (ulong)local_130) {
            lVar9 = *plVar2 + (ulong)*(uint *)(*plVar6 + (ulong)(uint)puVar3[uVar8] * 4);
            lVar7 = *plVar2 + (ulong)*(uint *)(*plVar6 + (ulong)(uint)puVar3[lVar7 + 2] * 4);
            uVar4 = (uint)*(ushort *)(lVar9 + 0x1c);
            uVar5 = (uint)*(ushort *)(lVar7 + 0x1c);
            local_b9 = 0;
            local_ba = 0;
            local_a0 = (byte *)(lVar9 + 0x2e);
            local_b0 = (byte *)(lVar7 + 0x2e);
            local_1bc = uVar5;
            if (uVar4 < uVar5) {
              local_1bc = uVar4;
            }
            pbVar10 = local_a0 + local_1bc;
            for (; local_a0 < pbVar10; local_a0 = local_a0 + 1) {
              if ((*local_a0 < 0x41) || (0x5a < *local_a0)) {
                local_b9 = *local_a0;
              }
              else {
                local_b9 = *local_a0 + 0x20;
              }
              if ((*local_b0 < 0x41) || (0x5a < *local_b0)) {
                local_ba = *local_b0;
              }
              else {
                local_ba = *local_b0 + 0x20;
              }
              if (local_b9 != local_ba) break;
              local_b0 = local_b0 + 1;
            }
            if (local_a0 == pbVar10) {
              local_1aa = uVar4 < uVar5;
            }
            else {
              local_1aa = local_b9 < local_ba;
            }
          }
          lVar7 = local_1aa + uVar8;
          lVar9 = *plVar2 + (ulong)*(uint *)(*plVar6 + (ulong)(uint)puVar3[local_160] * 4);
          lVar11 = *plVar2 + (ulong)*(uint *)(*plVar6 + (ulong)(uint)puVar3[lVar7] * 4);
          uVar4 = (uint)*(ushort *)(lVar9 + 0x1c);
          uVar5 = (uint)*(ushort *)(lVar11 + 0x1c);
          local_f9 = 0;
          local_fa = 0;
          local_e0 = (byte *)(lVar9 + 0x2e);
          local_f0 = (byte *)(lVar11 + 0x2e);
          local_1dc = uVar5;
          if (uVar4 < uVar5) {
            local_1dc = uVar4;
          }
          pbVar10 = local_e0 + local_1dc;
          for (; local_e0 < pbVar10; local_e0 = local_e0 + 1) {
            if ((*local_e0 < 0x41) || (0x5a < *local_e0)) {
              local_f9 = *local_e0;
            }
            else {
              local_f9 = *local_e0 + 0x20;
            }
            if ((*local_f0 < 0x41) || (0x5a < *local_f0)) {
              local_fa = *local_f0;
            }
            else {
              local_fa = *local_f0 + 0x20;
            }
            if (local_f9 != local_fa) break;
            local_f0 = local_f0 + 1;
          }
          if (local_e0 == pbVar10) {
            bVar12 = uVar4 < uVar5;
          }
          else {
            bVar12 = local_f9 < local_fa;
          }
          if (!bVar12) break;
          uVar1 = puVar3[local_160];
          puVar3[local_160] = puVar3[lVar7];
          puVar3[lVar7] = uVar1;
          local_160 = lVar7;
        }
      } while( true );
    }
    local_12c = local_12c - 1;
  } while( true );
}

Assistant:

static void
mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip) {
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices;
  mz_uint32 start, end;
  const mz_uint32 size = pZip->m_total_files;

  if (size <= 1U)
    return;

  pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets,
                                   mz_uint32, 0);

  start = (size - 2U) >> 1U;
  for (;;) {
    mz_uint64 child, root = start;
    for (;;) {
      if ((child = (root << 1U) + 1U) >= size)
        break;
      child += (((child + 1U) < size) &&
                (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                             pIndices[child],
                                             pIndices[child + 1U])));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    if (!start)
      break;
    start--;
  }

  end = size - 1;
  while (end > 0) {
    mz_uint64 child, root = 0;
    MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
    for (;;) {
      if ((child = (root << 1U) + 1U) >= end)
        break;
      child +=
          (((child + 1U) < end) &&
           mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[child], pIndices[child + 1U]));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    end--;
  }
}